

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix4f.cpp
# Opt level: O0

Matrix4f *
Matrix4f::infinitePerspectiveProjection
          (float fLeft,float fRight,float fBottom,float fTop,float fZNear,bool directX)

{
  float *pfVar1;
  byte in_SIL;
  Matrix4f *in_RDI;
  float in_XMM0_Da;
  float in_XMM1_Da;
  float in_XMM2_Da;
  float in_XMM3_Da;
  float in_XMM4_Da;
  Matrix4f *projection;
  
  Matrix4f(in_RDI,0.0);
  pfVar1 = operator()(in_RDI,0,0);
  *pfVar1 = (in_XMM4_Da * 2.0) / (in_XMM1_Da - in_XMM0_Da);
  pfVar1 = operator()(in_RDI,1,1);
  *pfVar1 = (in_XMM4_Da * 2.0) / (in_XMM3_Da - in_XMM2_Da);
  pfVar1 = operator()(in_RDI,0,2);
  *pfVar1 = (in_XMM1_Da + in_XMM0_Da) / (in_XMM1_Da - in_XMM0_Da);
  pfVar1 = operator()(in_RDI,1,2);
  *pfVar1 = (in_XMM3_Da + in_XMM2_Da) / (in_XMM3_Da - in_XMM2_Da);
  pfVar1 = operator()(in_RDI,3,2);
  *pfVar1 = -1.0;
  if ((in_SIL & 1) == 0) {
    pfVar1 = operator()(in_RDI,2,2);
    *pfVar1 = -1.0;
    pfVar1 = operator()(in_RDI,2,3);
    *pfVar1 = in_XMM4_Da * -2.0;
  }
  else {
    pfVar1 = operator()(in_RDI,2,2);
    *pfVar1 = -1.0;
    pfVar1 = operator()(in_RDI,2,3);
    *pfVar1 = -in_XMM4_Da;
  }
  return in_RDI;
}

Assistant:

Matrix4f Matrix4f::infinitePerspectiveProjection( float fLeft, float fRight,
												 float fBottom, float fTop,
												 float fZNear, bool directX )
{
	Matrix4f projection;

	projection( 0, 0 ) = ( 2.0f * fZNear ) / ( fRight - fLeft );
	projection( 1, 1 ) = ( 2.0f * fZNear ) / ( fTop - fBottom );
	projection( 0, 2 ) = ( fRight + fLeft ) / ( fRight - fLeft );
	projection( 1, 2 ) = ( fTop + fBottom ) / ( fTop - fBottom );
	projection( 3, 2 ) = -1;

	// infinite view frustum
	// just take the limit as far --> inf of the regular frustum
	if( directX )
	{
		projection( 2, 2 ) = -1.0f;
		projection( 2, 3 ) = -fZNear;		
	}
	else
	{
		projection( 2, 2 ) = -1.0f;
		projection( 2, 3 ) = -2.0f * fZNear;
	}

	return projection;
}